

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_hash_set.c
# Opt level: O3

_Bool TIFFHashSetRemove(TIFFHashSet *set,void *elt)

{
  _Bool _Var1;
  unsigned_long uVar2;
  int iVar3;
  _TIFFList **pp_Var4;
  TIFFList *pTVar5;
  TIFFList *__ptr;
  
  if (set == (TIFFHashSet *)0x0) {
    __assert_fail("set != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_hash_set.c"
                  ,0x207,"_Bool TIFFHashSetRemoveInternal(TIFFHashSet *, const void *, _Bool)");
  }
  if ((0 < set->nIndiceAllocatedSize) && (set->nSize <= set->nAllocatedSize / 2)) {
    set->nIndiceAllocatedSize = set->nIndiceAllocatedSize + -1;
    _Var1 = TIFFHashSetRehash(set);
    if (!_Var1) {
      set->nIndiceAllocatedSize = set->nIndiceAllocatedSize + 1;
      return false;
    }
  }
  uVar2 = (*set->fnHashFunc)(elt);
  _Var1 = false;
  iVar3 = (int)(uVar2 % (ulong)(long)set->nAllocatedSize);
  __ptr = set->tabList[iVar3];
  if (__ptr != (TIFFList *)0x0) {
    _Var1 = (*set->fnEqualFunc)(__ptr->pData,elt);
    if (_Var1) {
      pp_Var4 = set->tabList + iVar3;
    }
    else {
      do {
        pTVar5 = __ptr;
        __ptr = pTVar5->psNext;
        if (__ptr == (_TIFFList *)0x0) {
          return false;
        }
        _Var1 = (*set->fnEqualFunc)(__ptr->pData,elt);
      } while (!_Var1);
      pp_Var4 = &pTVar5->psNext;
    }
    *pp_Var4 = __ptr->psNext;
    if (set->fnFreeEltFunc != (TIFFHashSetFreeEltFunc)0x0) {
      (*set->fnFreeEltFunc)(__ptr->pData);
    }
    iVar3 = set->nRecyclingListSize;
    if (iVar3 < 0x80) {
      __ptr->psNext = set->psRecyclingList;
      set->psRecyclingList = __ptr;
      set->nRecyclingListSize = iVar3 + 1;
    }
    else {
      free(__ptr);
    }
    set->nSize = set->nSize + -1;
    _Var1 = true;
  }
  return _Var1;
}

Assistant:

static bool TIFFHashSetRemoveInternal(TIFFHashSet *set, const void *elt,
                                      bool bDeferRehash)
{
    assert(set != NULL);
    if (set->nIndiceAllocatedSize > 0 && set->nSize <= set->nAllocatedSize / 2)
    {
        set->nIndiceAllocatedSize--;
        if (bDeferRehash)
            set->bRehash = true;
        else
        {
            if (!TIFFHashSetRehash(set))
            {
                set->nIndiceAllocatedSize++;
                return false;
            }
        }
    }

    int nHashVal = (int)(set->fnHashFunc(elt) % set->nAllocatedSize);
    TIFFList *cur = set->tabList[nHashVal];
    TIFFList *prev = NULL;
    while (cur)
    {
        if (set->fnEqualFunc(cur->pData, elt))
        {
            if (prev)
                prev->psNext = cur->psNext;
            else
                set->tabList[nHashVal] = cur->psNext;

            if (set->fnFreeEltFunc)
                set->fnFreeEltFunc(cur->pData);

            TIFFHashSetReturnListElt(set, cur);
#ifdef HASH_DEBUG
            if (set->tabList[nHashVal])
                set->nCollisions--;
#endif
            set->nSize--;
            return true;
        }
        prev = cur;
        cur = cur->psNext;
    }
    return false;
}